

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O0

bool __thiscall
Shell::AnswerLiteralManager::tryGetAnswer
          (AnswerLiteralManager *this,Clause *refutation,Stack<Kernel::Clause_*> *answer)

{
  bool bVar1;
  InferenceRule IVar2;
  Unit *this_00;
  Inference *this_01;
  Unit *in_RSI;
  Inference *inf3;
  Unit *anEmpty;
  Iterator it2;
  Inference *inf2;
  Unit *prem;
  Iterator it;
  bool added;
  Inference *inf;
  Inference *in_stack_ffffffffffffffa0;
  Unit *in_stack_ffffffffffffffa8;
  anon_union_8_2_756040a0_for_Iterator_0 local_38;
  byte local_29;
  Inference *local_28;
  bool local_1;
  
  local_28 = Kernel::Unit::inference(in_RSI);
  bVar1 = pushFirstPremiseToAnswerIfFromResolver
                    ((Inference *)in_stack_ffffffffffffffa8,
                     (Stack<Kernel::Clause_*> *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_1 = true;
  }
  else {
    IVar2 = Kernel::Inference::rule(local_28);
    if (IVar2 == AVATAR_REFUTATION) {
      local_29 = 0;
      local_38 = (anon_union_8_2_756040a0_for_Iterator_0)Kernel::Inference::iterator(local_28);
      while (bVar1 = Kernel::Inference::hasNext(local_28,(Iterator *)&local_38), bVar1) {
        this_00 = Kernel::Inference::next
                            ((Inference *)in_stack_ffffffffffffffa8,
                             (Iterator *)in_stack_ffffffffffffffa0);
        this_01 = Kernel::Unit::inference(this_00);
        IVar2 = Kernel::Inference::rule(this_01);
        if (IVar2 == AVATAR_CONTRADICTION_CLAUSE) {
          Kernel::Inference::iterator(this_01);
          in_stack_ffffffffffffffa8 =
               Kernel::Inference::next
                         ((Inference *)in_stack_ffffffffffffffa8,
                          (Iterator *)in_stack_ffffffffffffffa0);
          in_stack_ffffffffffffffa0 = Kernel::Unit::inference(in_stack_ffffffffffffffa8);
          bVar1 = pushFirstPremiseToAnswerIfFromResolver
                            ((Inference *)in_stack_ffffffffffffffa8,
                             (Stack<Kernel::Clause_*> *)in_stack_ffffffffffffffa0);
          local_29 = (local_29 & 1) != 0 || bVar1;
        }
      }
      local_1 = (bool)(local_29 & 1);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool AnswerLiteralManager::tryGetAnswer(Clause* refutation, Stack<Clause*>& answer)
{
  ASS(refutation->isEmpty());

  Inference& inf = refutation->inference();
  if (pushFirstPremiseToAnswerIfFromResolver(inf,answer)) {
    return true;
  } else if (inf.rule() == InferenceRule::AVATAR_REFUTATION) {
    bool added = false;
    auto it = inf.iterator();
    while (inf.hasNext(it)) {
      Unit* prem = inf.next(it);
      Inference& inf2 = prem->inference();
      if (inf2.rule() == InferenceRule::AVATAR_CONTRADICTION_CLAUSE) {
        auto it2 = inf2.iterator();
        Unit* anEmpty = inf2.next(it2);
        ASS(!inf2.hasNext(it2));
        Inference& inf3 = anEmpty->inference();
        added |= pushFirstPremiseToAnswerIfFromResolver(inf3,answer);
      }
    }
    return added;
  }
  // currently does nothing for AVATAR_REFUTATION_SMT (which does not get minimized)

  return false;
}